

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PFloat::WriteValue(PFloat *this,FArchive *ar,void *addr)

{
  double local_30;
  double doubleprecision;
  void *pvStack_20;
  float singleprecision;
  void *addr_local;
  FArchive *ar_local;
  PFloat *this_local;
  
  pvStack_20 = addr;
  addr_local = ar;
  ar_local = (FArchive *)this;
  if (*(int *)&(this->super_PBasicType).super_PType.super_DObject.field_0x24 == 8) {
    local_30 = *addr;
    doubleprecision._4_4_ = (float)local_30;
    if (((double)doubleprecision._4_4_ != local_30) ||
       (NAN((double)doubleprecision._4_4_) || NAN(local_30))) {
      FArchive::WriteByte(ar,'\v');
      FArchive::operator<<((FArchive *)addr_local,&local_30);
      return;
    }
  }
  else {
    doubleprecision._4_4_ = *addr;
  }
  FArchive::WriteByte(ar,'\n');
  FArchive::operator<<((FArchive *)addr_local,(float *)((long)&doubleprecision + 4));
  return;
}

Assistant:

void PFloat::WriteValue(FArchive &ar, const void *addr) const
{
	float singleprecision;
	if (Size == 8)
	{
		// If it can be written as single precision without information
		// loss, then prefer that over writing a full-sized double.
		double doubleprecision = *(double *)addr;
		singleprecision = (float)doubleprecision;
		if (singleprecision != doubleprecision)
		{
			ar.WriteByte(VAL_Float64);
			ar << doubleprecision;
			return;
		}
	}
	else
	{
		singleprecision = *(float *)addr;
	}
	ar.WriteByte(VAL_Float32);
	ar << singleprecision;
}